

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generator.cc
# Opt level: O0

void __thiscall generator_var_var_slicing_Test::TestBody(generator_var_var_slicing_Test *this)

{
  AssignmentType type;
  Generator *pGVar1;
  Var *pVVar2;
  Port *pPVar3;
  shared_ptr<kratos::Var> sVar4;
  enable_shared_from_this<kratos::Var> local_230;
  undefined1 local_220 [39];
  allocator<char> local_1f9;
  string local_1f8;
  Port *local_1d8;
  Port *out;
  string local_1c8;
  Port *local_1a8;
  Port *in;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context c;
  generator_var_var_slicing_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar1 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&in + 7));
  pVVar2 = kratos::Generator::var(pGVar1,&local_198,0x10,4);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in + 7));
  pGVar1 = local_138;
  local_178 = pVVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"in",(allocator<char> *)((long)&out + 7));
  pPVar3 = kratos::Generator::port(pGVar1,In,&local_1c8,2);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
  pGVar1 = local_138;
  local_1a8 = pPVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"out",&local_1f9);
  pPVar3 = kratos::Generator::port(pGVar1,Out,&local_1f8,0x10);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  pGVar1 = local_138;
  pVVar2 = local_178;
  local_1d8 = pPVar3;
  sVar4 = std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_230);
  type = (*(pVVar2->super_IRNode)._vptr_IRNode[10])
                   (pVVar2,&local_230,
                    sVar4.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi._M_pi);
  kratos::Var::assign((Var *)local_220,&pPVar3->super_Var,type);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_220 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_220);
  kratos::Generator::add_stmt(pGVar1,(shared_ptr<kratos::Stmt> *)(local_220 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_220 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_220);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_230);
  kratos::check_mixed_assignment(local_138);
  kratos::verify_generator_connectivity(local_138);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(generator, var_var_slicing) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 16, 4);
    auto &in = mod.port(PortDirection::In, "in", 2);
    auto &out = mod.port(PortDirection::Out, "out", 16);
    mod.add_stmt(out.assign(a[in.shared_from_this()], AssignmentType::Blocking));

    check_mixed_assignment(&mod);
    verify_generator_connectivity(&mod);
}